

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O1

void __thiscall
TileSwitch::TileSwitch
          (TileSwitch *this,Board *boardPtr,Vector2u *position,bool noAdjacentUpdates,char charID,
          State state)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  iterator __position;
  pointer pVVar5;
  Vector2f VVar6;
  vector<TileSwitch*,std::allocator<TileSwitch*>> *this_00;
  Font *font;
  mapped_type *pmVar7;
  Vector2u *pVVar8;
  unordered_map<Tile_*,_sf::Text,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>_>
  *this_01;
  char local_1d1;
  key_type local_1d0;
  key_type local_1c8;
  string local_1c0;
  undefined1 local_1a0 [16];
  undefined1 local_190 [20];
  Vector2f VStack_17c;
  float local_174 [2];
  float afStack_16c [2];
  float local_164 [2];
  float afStack_15c [2];
  float local_154 [2];
  float afStack_14c [2];
  float local_144 [2];
  float afStack_13c [2];
  bool local_134;
  float local_130 [2];
  float afStack_128 [2];
  float local_120 [2];
  float afStack_118 [2];
  float local_110 [2];
  float afStack_108 [2];
  float local_100 [2];
  float afStack_f8 [2];
  bool local_f0;
  String local_e8;
  Font *local_c8;
  uint uStack_c0;
  float fStack_bc;
  float local_b8;
  Uint32 UStack_b4;
  Color CStack_b0;
  Color CStack_ac;
  float local_a8;
  undefined **local_a0;
  pointer local_98;
  pointer pVStack_90;
  pointer local_88;
  PrimitiveType local_80;
  undefined **local_78;
  pointer local_70;
  pointer pVStack_68;
  pointer local_60;
  PrimitiveType local_58;
  FloatRect local_50;
  bool local_40;
  undefined7 uStack_3f;
  Uint64 UStack_38;
  
  local_1d1 = charID;
  Tile::Tile(&this->super_Tile,boardPtr,position,true,true);
  (this->super_Tile)._vptr_Tile = (_func_int **)&PTR__TileSwitch_001d1f88;
  (this->super_Tile).field_0x21 = local_1d1;
  *(State *)&(this->super_Tile).field_0x24 = state;
  this_00 = (vector<TileSwitch*,std::allocator<TileSwitch*>> *)
            std::__detail::
            _Map_base<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&boardPtr->switchKeybinds,&local_1d1);
  __position._M_current = *(TileSwitch ***)(this_00 + 8);
  local_1a0._0_8_ = this;
  if (__position._M_current == *(TileSwitch ***)(this_00 + 0x10)) {
    std::vector<TileSwitch*,std::allocator<TileSwitch*>>::_M_realloc_insert<TileSwitch*>
              (this_00,__position,(TileSwitch **)local_1a0);
  }
  else {
    *__position._M_current = this;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  std::locale::locale((locale *)&local_1c8);
  sf::String::String((String *)&local_1c0,"",(locale *)&local_1c8);
  font = Board::getFont();
  sf::Text::Text((Text *)local_1a0,(String *)&local_1c0,font,0x19);
  this_01 = &boardPtr->tileLabels;
  local_1d0 = &this->super_Tile;
  pmVar7 = std::__detail::
           _Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,&local_1d0);
  VVar6.y = (float)local_190._12_4_;
  VVar6.x = (float)local_190._8_4_;
  *(ulong *)&(pmVar7->super_Transformable).m_position.y =
       CONCAT44(local_190._16_4_,local_190._12_4_);
  (pmVar7->super_Transformable).m_scale = VStack_17c;
  (pmVar7->super_Transformable).m_origin.x = (float)local_190._0_4_;
  (pmVar7->super_Transformable).m_origin.y = (float)local_190._4_4_;
  (pmVar7->super_Transformable).m_position = VVar6;
  *(float (*) [2])(pmVar7->super_Transformable).m_transform.m_matrix = local_174;
  *(float (*) [2])((pmVar7->super_Transformable).m_transform.m_matrix + 2) = afStack_16c;
  *(float (*) [2])((pmVar7->super_Transformable).m_transform.m_matrix + 4) = local_164;
  *(float (*) [2])((pmVar7->super_Transformable).m_transform.m_matrix + 6) = afStack_15c;
  *(float (*) [2])((pmVar7->super_Transformable).m_transform.m_matrix + 8) = local_154;
  *(float (*) [2])((pmVar7->super_Transformable).m_transform.m_matrix + 10) = afStack_14c;
  *(float (*) [2])((pmVar7->super_Transformable).m_transform.m_matrix + 0xc) = local_144;
  *(float (*) [2])((pmVar7->super_Transformable).m_transform.m_matrix + 0xe) = afStack_13c;
  (pmVar7->super_Transformable).m_transformNeedUpdate = local_134;
  *(float (*) [2])((pmVar7->super_Transformable).m_inverseTransform.m_matrix + 0xc) = local_100;
  *(float (*) [2])((pmVar7->super_Transformable).m_inverseTransform.m_matrix + 0xe) = afStack_f8;
  *(float (*) [2])((pmVar7->super_Transformable).m_inverseTransform.m_matrix + 8) = local_110;
  *(float (*) [2])((pmVar7->super_Transformable).m_inverseTransform.m_matrix + 10) = afStack_108;
  *(float (*) [2])((pmVar7->super_Transformable).m_inverseTransform.m_matrix + 4) = local_120;
  *(float (*) [2])((pmVar7->super_Transformable).m_inverseTransform.m_matrix + 6) = afStack_118;
  *(float (*) [2])(pmVar7->super_Transformable).m_inverseTransform.m_matrix = local_130;
  *(float (*) [2])((pmVar7->super_Transformable).m_inverseTransform.m_matrix + 2) = afStack_128;
  (pmVar7->super_Transformable).m_inverseTransformNeedUpdate = local_f0;
  sf::String::operator=(&pmVar7->m_string,&local_e8);
  pmVar7->m_outlineThickness = local_a8;
  pmVar7->m_lineSpacingFactor = local_b8;
  pmVar7->m_style = UStack_b4;
  pmVar7->m_fillColor = CStack_b0;
  pmVar7->m_outlineColor = CStack_ac;
  pmVar7->m_font = local_c8;
  pmVar7->m_characterSize = uStack_c0;
  pmVar7->m_letterSpacingFactor = fStack_bc;
  pVVar5 = (pmVar7->m_vertices).m_vertices.
           super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pmVar7->m_vertices).m_vertices.super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>.
  _M_impl.super__Vector_impl_data._M_start = local_98;
  (pmVar7->m_vertices).m_vertices.super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVStack_90;
  (pmVar7->m_vertices).m_vertices.super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_88;
  local_98 = (pointer)0x0;
  pVStack_90 = (pointer)0x0;
  local_88 = (pointer)0x0;
  if (pVVar5 != (pointer)0x0) {
    operator_delete(pVVar5);
  }
  (pmVar7->m_vertices).m_primitiveType = local_80;
  pVVar5 = (pmVar7->m_outlineVertices).m_vertices.
           super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pmVar7->m_outlineVertices).m_vertices.super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_start = local_70;
  (pmVar7->m_outlineVertices).m_vertices.super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_finish = pVStack_68;
  (pmVar7->m_outlineVertices).m_vertices.super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_60;
  local_70 = (pointer)0x0;
  pVStack_68 = (pointer)0x0;
  local_60 = (pointer)0x0;
  if (pVVar5 != (pointer)0x0) {
    operator_delete(pVVar5);
  }
  (pmVar7->m_outlineVertices).m_primitiveType = local_58;
  pmVar7->m_geometryNeedUpdate = local_40;
  *(undefined7 *)&pmVar7->field_0x161 = uStack_3f;
  pmVar7->m_fontTextureId = UStack_38;
  (pmVar7->m_bounds).left = local_50.left;
  (pmVar7->m_bounds).top = local_50.top;
  (pmVar7->m_bounds).width = local_50.width;
  (pmVar7->m_bounds).height = local_50.height;
  local_1a0._0_8_ = &PTR__Text_001d26c0;
  local_1a0._8_8_ = &PTR__Text_001d26e8;
  local_78 = &PTR__VertexArray_001d2740;
  if (local_70 != (pointer)0x0) {
    operator_delete(local_70);
  }
  local_a0 = &PTR__VertexArray_001d2740;
  if (local_98 != (pointer)0x0) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_e8.m_string._M_dataplus._M_p != &local_e8.m_string.field_2) {
    operator_delete(local_e8.m_string._M_dataplus._M_p);
  }
  sf::Transformable::~Transformable((Transformable *)(local_1a0 + 8));
  paVar1 = &local_1c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  std::locale::~locale((locale *)&local_1c8);
  local_1c8 = &this->super_Tile;
  pmVar7 = std::__detail::
           _Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,&local_1c8);
  local_1c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_1c0,'\x01');
  std::locale::locale((locale *)&local_1d0);
  sf::String::String((String *)local_1a0,&local_1c0,(locale *)&local_1d0);
  sf::Text::setString(pmVar7,(String *)local_1a0);
  if ((TileSwitch *)local_1a0._0_8_ != (TileSwitch *)local_190) {
    operator_delete((void *)local_1a0._0_8_);
  }
  std::locale::~locale((locale *)&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  local_1a0._0_8_ = this;
  pmVar7 = std::__detail::
           _Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,(key_type *)local_1a0);
  pVVar8 = Tile::getPosition(&this->super_Tile);
  uVar2 = pVVar8->x;
  pVVar8 = Board::getTileSize();
  uVar3 = pVVar8->x;
  pVVar8 = Tile::getPosition(&this->super_Tile);
  uVar4 = pVVar8->y;
  pVVar8 = Board::getTileSize();
  sf::Transformable::setPosition
            (&pmVar7->super_Transformable,(float)(uVar2 * uVar3) + 9.0,
             (float)(uVar4 * pVVar8->y) + -2.0);
  (*(this->super_Tile)._vptr_Tile[8])(this,0,(ulong)noAdjacentUpdates);
  return;
}

Assistant:

TileSwitch::TileSwitch(Board* boardPtr, const Vector2u& position, bool noAdjacentUpdates, char charID, State state) : Tile(boardPtr, position, true, true) {
    _charID = charID;
    _state = state;
    boardPtr->switchKeybinds[charID].push_back(this);
    boardPtr->tileLabels[this] = Text("", Board::getFont(), 25);
    boardPtr->tileLabels[this].setString(string(1, charID));
    boardPtr->tileLabels[this].setPosition(getPosition().x * Board::getTileSize().x + 9.0f, getPosition().y * Board::getTileSize().y - 2.0f);
    addUpdate(false, noAdjacentUpdates);
}